

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManDfsForCrossCut(Gia_Man_t *p,int fReverse)

{
  int iVar1;
  Vec_Int_t *vNodes_00;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes;
  int fReverse_local;
  Gia_Man_t *p_local;
  
  Gia_ManCleanValue(p);
  iVar1 = Gia_ManObjNum(p);
  vNodes_00 = Vec_IntAlloc(iVar1);
  Gia_ManIncrementTravId(p);
  if (fReverse == 0) {
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar3 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCo(p,local_2c);
        bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      pGVar2 = Gia_ObjFanin0(pGStack_28);
      iVar1 = Gia_ObjIsConst0(pGVar2);
      if (iVar1 == 0) {
        Gia_ManDfsForCrossCut_rec(p,pGStack_28,vNodes_00);
      }
      local_2c = local_2c + 1;
    }
  }
  else {
    local_2c = Vec_IntSize(p->vCos);
    while( true ) {
      local_2c = local_2c + -1;
      bVar3 = false;
      if (-1 < local_2c) {
        pGStack_28 = Gia_ManCo(p,local_2c);
        bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      pGVar2 = Gia_ObjFanin0(pGStack_28);
      iVar1 = Gia_ObjIsConst0(pGVar2);
      if (iVar1 == 0) {
        Gia_ManDfsForCrossCut_rec(p,pGStack_28,vNodes_00);
      }
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Int_t * Gia_ManDfsForCrossCut( Gia_Man_t * p, int fReverse )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanValue( p );
    vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    if ( fReverse )
    {
        Gia_ManForEachCoReverse( p, pObj, i )
            if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
                Gia_ManDfsForCrossCut_rec( p, pObj, vNodes );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
                Gia_ManDfsForCrossCut_rec( p, pObj, vNodes );
    }
    return vNodes;
}